

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QLoggingRule>::growAppend
          (QCommonArrayOps<QLoggingRule> *this,QLoggingRule *b,QLoggingRule *e)

{
  long n;
  QLoggingRule *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QLoggingRule> local_48;
  QLoggingRule *b_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  b_local = b;
  if (b != e) {
    n = ((long)e - (long)b) / 0x28;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QLoggingRule *)0x0;
    pQVar1 = (this->super_Type).super_QGenericArrayOps<QLoggingRule>.
             super_QArrayDataPointer<QLoggingRule>.ptr;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QGenericArrayOps<QLoggingRule>.
                 super_QArrayDataPointer<QLoggingRule>.size <= b)) {
      QArrayDataPointer<QLoggingRule>::detachAndGrow
                ((QArrayDataPointer<QLoggingRule> *)this,GrowsAtEnd,n,(QLoggingRule **)0x0,
                 (QArrayDataPointer<QLoggingRule> *)0x0);
      pQVar1 = b;
    }
    else {
      QArrayDataPointer<QLoggingRule>::detachAndGrow
                ((QArrayDataPointer<QLoggingRule> *)this,GrowsAtEnd,n,&b_local,&local_48);
      pQVar1 = b_local;
    }
    QGenericArrayOps<QLoggingRule>::copyAppend
              ((QGenericArrayOps<QLoggingRule> *)this,pQVar1,
               (QLoggingRule *)(((long)e - (long)b) + (long)pQVar1));
    QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }